

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void DoIt(bool allIntensityBinsCheck)

{
  undefined1 local_30c8 [8];
  ValidateVulnerability vV;
  bool allIntensityBinsCheck_local;
  
  vV._12471_1_ = allIntensityBinsCheck;
  ValidateVulnerability::ValidateVulnerability
            ((ValidateVulnerability *)local_30c8,allIntensityBinsCheck);
  Validate::SkipHeaderRow((Validate *)&vV);
  ValidateVulnerability::ReadVulnerabilityFile((ValidateVulnerability *)local_30c8);
  ValidateVulnerability::PrintMaximumDamageBinIndex((ValidateVulnerability *)local_30c8);
  Validate::PrintSuccessMessage((Validate *)&vV);
  ValidateVulnerability::~ValidateVulnerability((ValidateVulnerability *)local_30c8);
  return;
}

Assistant:

void DoIt(const bool allIntensityBinsCheck) {

  ValidateVulnerability vV(allIntensityBinsCheck);
  vV.SkipHeaderRow();
  vV.ReadVulnerabilityFile();
  vV.PrintMaximumDamageBinIndex();
  vV.PrintSuccessMessage();

}